

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O1

int * __thiscall mpt::value_store::set<int>(value_store *this,span<const_int> *data,long pos)

{
  int *piVar1;
  
  if ((set<int>::traits == (type_traits *)0x0) &&
     (set<int>::traits = (type_traits *)mpt::type_traits::get(0x69),
     set<int>::traits == (type_traits *)0x0)) {
    return (int *)0x0;
  }
  piVar1 = (int *)mpt::value_store::set
                            ((type_traits *)this,(ulong)set<int>::traits,
                             (void *)(data->_len & 0xfffffffffffffffc),(long)data->_base);
  if (piVar1 != (int *)0x0) {
    this->_type = 0x69;
  }
  return piVar1;
}

Assistant:

T *set(const span<const T> &data, long pos = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		void *ptr = set(*traits, data.size() * sizeof(T), data.begin(), pos);
		if (ptr) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<T *>(ptr);
	}